

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O3

lys_node *
lys_node_dup_recursion
          (lys_module *module,lys_node *parent,lys_node *node,unres_schema *unres,int shallow,
          int finalize)

{
  byte bVar1;
  uint8_t uVar2;
  LYS_NODE LVar3;
  lys_iffeature *plVar4;
  lys_module *plVar5;
  uint uVar6;
  lys_node_list *plVar7;
  lys_node_list *plVar8;
  ushort uVar9;
  int iVar10;
  lys_node_list *plVar11;
  lys_node_list *plVar12;
  lys_node_list *plVar13;
  char *pcVar14;
  lys_iffeature *plVar15;
  uint8_t *__dest;
  lys_feature **pplVar16;
  lys_when *plVar17;
  lys_restr *plVar18;
  lys_node *plVar19;
  lys_node *plVar20;
  lys_node_leaf **pplVar21;
  lys_node *plVar22;
  lys_unique *plVar23;
  char **ppcVar24;
  undefined8 *new_item;
  ulong uVar25;
  lys_module *plVar26;
  ushort uVar27;
  size_t __size;
  lys_node_list *plVar28;
  ly_ctx *ctx;
  undefined8 uVar29;
  undefined4 uVar30;
  long lVar31;
  lys_module *module_00;
  ulong uVar32;
  int_log_opts local_b0;
  uint local_ac;
  int_log_opts prev_ilo;
  uint size1;
  ly_ctx *local_a0;
  uint local_94;
  unres_schema *puStack_90;
  uint size2;
  lys_node *local_88;
  lys_node_list *list_orig;
  lys_node_list *local_78;
  lys_type *local_70;
  lys_node_list *local_68;
  lys_module *local_60;
  undefined4 local_54;
  lys_node_list *local_50;
  lys_node_list *local_48;
  lys_node *local_40;
  int local_34;
  
  ctx = module->ctx;
  LVar3 = node->nodetype;
  local_70 = (lys_type *)CONCAT44(local_70._4_4_,finalize);
  local_88 = node;
  local_40 = node;
  local_34 = shallow;
  if ((int)LVar3 < 0x80) {
    if ((int)LVar3 < 0x10) {
      switch(LVar3) {
      case LYS_CONTAINER:
        plVar28 = (lys_node_list *)calloc(1,0x90);
        local_48 = (lys_node_list *)0x0;
        local_78 = (lys_node_list *)0x0;
        _prev_ilo = (lys_node_list *)0x0;
        list_orig = (lys_node_list *)0x0;
        plVar12 = (lys_node_list *)0x0;
        local_68 = (lys_node_list *)0x0;
        plVar13 = plVar28;
        break;
      case LYS_CHOICE:
        local_48 = (lys_node_list *)calloc(1,0x78);
        plVar28 = (lys_node_list *)0x0;
        local_78 = (lys_node_list *)0x0;
        _prev_ilo = (lys_node_list *)0x0;
        list_orig = (lys_node_list *)0x0;
        plVar12 = (lys_node_list *)0x0;
        local_68 = (lys_node_list *)0x0;
        plVar13 = local_48;
        break;
      default:
        goto switchD_0015f55f_caseD_3;
      case LYS_LEAF:
        local_78 = (lys_node_list *)calloc(1,0xd0);
        plVar28 = (lys_node_list *)0x0;
        local_48 = (lys_node_list *)0x0;
        _prev_ilo = (lys_node_list *)0x0;
        list_orig = (lys_node_list *)0x0;
        plVar12 = (lys_node_list *)0x0;
        local_68 = (lys_node_list *)0x0;
        plVar13 = local_78;
        break;
      case LYS_LEAFLIST:
        _prev_ilo = (lys_node_list *)calloc(1,0xd8);
        plVar28 = (lys_node_list *)0x0;
        local_48 = (lys_node_list *)0x0;
        local_78 = (lys_node_list *)0x0;
        list_orig = (lys_node_list *)0x0;
        plVar12 = (lys_node_list *)0x0;
        local_68 = (lys_node_list *)0x0;
        plVar13 = _prev_ilo;
      }
LAB_0015f6c6:
      plVar11 = (lys_node_list *)0x0;
    }
    else {
      if (LVar3 == LYS_LIST) {
        list_orig = (lys_node_list *)calloc(1,0xa8);
        plVar28 = (lys_node_list *)0x0;
        local_48 = (lys_node_list *)0x0;
        local_78 = (lys_node_list *)0x0;
        _prev_ilo = (lys_node_list *)0x0;
        plVar12 = (lys_node_list *)0x0;
        local_68 = (lys_node_list *)0x0;
        plVar13 = list_orig;
        goto LAB_0015f6c6;
      }
      if (LVar3 == LYS_ANYXML) {
LAB_0015f66a:
        plVar12 = (lys_node_list *)calloc(1,0x80);
        plVar28 = (lys_node_list *)0x0;
        local_48 = (lys_node_list *)0x0;
        local_78 = (lys_node_list *)0x0;
        _prev_ilo = (lys_node_list *)0x0;
        list_orig = (lys_node_list *)0x0;
        local_68 = (lys_node_list *)0x0;
        plVar13 = plVar12;
        goto LAB_0015f6c6;
      }
      if (LVar3 != LYS_CASE) goto switchD_0015f55f_caseD_3;
      plVar11 = (lys_node_list *)calloc(1,0x70);
      plVar28 = (lys_node_list *)0x0;
      local_48 = (lys_node_list *)0x0;
      local_78 = (lys_node_list *)0x0;
      _prev_ilo = (lys_node_list *)0x0;
      list_orig = (lys_node_list *)0x0;
      plVar12 = (lys_node_list *)0x0;
      local_68 = (lys_node_list *)0x0;
      plVar13 = plVar11;
    }
    plVar20 = local_40;
    if (plVar13 == (lys_node_list *)0x0) {
      ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_node_dup_recursion");
      return (lys_node *)0x0;
    }
    pcVar14 = lydict_insert(ctx,local_40->name,0);
    plVar13->name = pcVar14;
    pcVar14 = lydict_insert(ctx,plVar20->dsc,0);
    plVar13->dsc = pcVar14;
    pcVar14 = lydict_insert(ctx,plVar20->ref,0);
    plVar13->ref = pcVar14;
    plVar13->flags = plVar20->flags;
    plVar13->module = module;
    plVar13->nodetype = plVar20->nodetype;
    plVar13->prev = (lys_node *)plVar13;
    iVar10 = unres_schema_find(unres,-1,&plVar20->ext,UNRES_EXT);
    if (iVar10 == -1) {
      uVar2 = plVar20->ext_size;
      plVar13->ext_size = uVar2;
      iVar10 = lys_ext_dup(ctx,module,plVar20->ext,uVar2,plVar13,LYEXT_PAR_NODE,&plVar13->ext,
                           local_34,unres);
      if (iVar10 != 0) goto LAB_00160501;
    }
    bVar1 = plVar20->iffeature_size;
    local_50 = plVar13;
    if ((ulong)bVar1 != 0) {
      plVar13->iffeature_size = bVar1;
      plVar15 = (lys_iffeature *)calloc((ulong)bVar1,0x20);
      plVar13->iffeature = plVar15;
      if (plVar15 != (lys_iffeature *)0x0) {
        plVar20 = local_40;
        if (local_34 != 0) goto LAB_0015f9dd;
        local_54 = (undefined4)CONCAT71((int7)((ulong)plVar15 >> 8),local_34 == 0);
        uVar25 = 0;
        local_a0 = ctx;
        puStack_90 = unres;
        local_60 = module;
        do {
          resolve_iffeature_getsizes(plVar20->iffeature + uVar25,&local_ac,&local_94);
          plVar15 = plVar13->iffeature;
          plVar20 = local_40;
          if (local_ac != 0) {
            uVar32 = (ulong)((local_ac & 3) != 0 || local_ac >> 2 != 0);
            __dest = (uint8_t *)malloc(uVar32);
            plVar15[uVar25].expr = __dest;
            ctx = local_a0;
            if (__dest == (uint8_t *)0x0) goto LAB_001604ef;
            memcpy(__dest,local_40->iffeature[uVar25].expr,uVar32);
            uVar6 = local_94;
            pplVar16 = (lys_feature **)calloc((ulong)local_94,8);
            plVar20 = local_40;
            plVar15[uVar25].features = pplVar16;
            if (pplVar16 == (lys_feature **)0x0) {
              ly_log(local_a0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                     "lys_node_dup_recursion");
              plVar13 = local_50;
              free(local_50->iffeature[uVar25].expr);
              goto LAB_00160501;
            }
            plVar13 = local_50;
            if (uVar6 != 0) {
              lVar31 = 0;
              uVar32 = 0;
              do {
                plVar7 = local_50;
                iVar10 = unres_schema_dup(local_60,puStack_90,
                                          (void *)((long)plVar20->iffeature[uVar25].features +
                                                  lVar31),UNRES_IFFEAT,
                                          (void *)((long)local_50->iffeature[uVar25].features +
                                                  lVar31));
                plVar13 = local_50;
                if (iVar10 == 1) {
                  *(undefined8 *)((long)plVar7->iffeature[uVar25].features + lVar31) =
                       *(undefined8 *)((long)plVar20->iffeature[uVar25].features + lVar31);
                }
                else if (iVar10 == -1) goto LAB_00160501;
                uVar32 = uVar32 + 1;
                lVar31 = lVar31 + 8;
              } while (uVar32 < local_94);
              plVar15 = local_50->iffeature;
            }
          }
          module = local_60;
          unres = puStack_90;
          plVar4 = plVar20->iffeature;
          uVar2 = plVar4[uVar25].ext_size;
          plVar15[uVar25].ext_size = uVar2;
          iVar10 = lys_ext_dup(local_a0,local_60,plVar4[uVar25].ext,uVar2,plVar15 + uVar25,
                               LYEXT_PAR_IFFEATURE,&plVar15[uVar25].ext,0,puStack_90);
          if (iVar10 != 0) goto LAB_00160501;
          uVar25 = uVar25 + 1;
          ctx = local_a0;
          uVar30 = local_54;
        } while (uVar25 < plVar20->iffeature_size);
LAB_0015fbef:
        uVar9 = 1;
        plVar20 = parent;
        do {
          while( true ) {
            plVar19 = plVar20;
            if (plVar19 == (lys_node *)0x0) goto LAB_0015fc37;
            if (plVar19->nodetype != LYS_USES) break;
            plVar20 = plVar19->parent;
          }
        } while ((plVar19->nodetype == LYS_AUGMENT) &&
                (plVar20 = plVar19->prev, plVar19->prev != (lys_node *)0x0));
        uVar9 = plVar19->flags & 3;
LAB_0015fc37:
        if ((int)local_70 == 2) {
          uVar9 = plVar13->flags & 0xfff8;
LAB_0015fdb5:
          plVar13->flags = uVar9;
        }
        else if ((int)local_70 == 1) {
          uVar27 = plVar13->flags;
          if ((uVar27 & 4) == 0) {
            if (plVar13->nodetype != LYS_USES) {
              uVar27 = uVar27 & 0xfff8 | uVar9;
              plVar13->flags = uVar27;
            }
            uVar9 = parent->flags & 0x38;
            if ((uVar27 & 0x38) < uVar9) {
              uVar9 = uVar9 | uVar27 & 0xffc7;
              goto LAB_0015fdb5;
            }
          }
          else if (((uVar9 & 2) != 0) && ((uVar27 & 1) != 0)) {
            ly_vlog(ctx,LYE_INARG,LY_VLOG_LYS,plVar13,"true","config");
            ly_vlog(ctx,LYE_SPEC,LY_VLOG_PREV,(void *)0x0,
                    "State nodes cannot have configuration nodes as children.");
            goto LAB_00160501;
          }
        }
        iVar10 = lys_node_addchild(parent,plVar13->module,(lys_node *)plVar13,0);
        if (iVar10 != 0) goto LAB_00160501;
        plVar20 = local_40;
        local_54 = uVar30;
        if ((local_40->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
          for (plVar19 = local_40->child; plVar19 != (lys_node *)0x0; plVar19 = plVar19->next) {
            if ((plVar19->nodetype & LYS_GROUPING) == LYS_UNKNOWN) {
              plVar22 = lys_node_dup_recursion
                                  (module,(lys_node *)plVar13,plVar19,unres,0,(int)local_70);
              plVar20 = local_40;
              if (plVar22 == (lys_node *)0x0) goto LAB_00160501;
            }
          }
        }
        uVar30 = local_54;
        if (((((int)local_70 == 1) && (plVar13->nodetype == LYS_LIST)) &&
            ((plVar13->flags & 1) != 0)) && (plVar20->padding[2] == '\0')) {
          ly_vlog(ctx,LYE_MISSCHILDSTMT,LY_VLOG_LYS,plVar13,"key","list");
          goto LAB_00160501;
        }
        goto LAB_0015f9f9;
      }
LAB_001601d0:
      ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_node_dup_recursion");
      goto LAB_00160501;
    }
    if (local_34 == 0) {
      uVar30 = (int)CONCAT71((int7)((ulong)plVar20 >> 8),1);
      goto LAB_0015fbef;
    }
LAB_0015f9dd:
    memcpy(plVar13->iffeature,plVar20->iffeature,(ulong)plVar13->iffeature_size << 5);
    plVar20 = local_40;
    uVar30 = 0;
LAB_0015f9f9:
    plVar8 = local_68;
    plVar7 = list_orig;
    plVar19 = local_88;
    LVar3 = plVar20->nodetype;
    if ((int)LVar3 < 0x80) {
      if ((int)LVar3 < 0x10) {
        switch(LVar3) {
        case LYS_CONTAINER:
          if ((lys_when *)plVar20[1].name != (lys_when *)0x0) {
            plVar17 = lys_when_dup(module,(lys_when *)plVar20[1].name,local_34,unres);
            plVar28->when = plVar17;
            plVar20 = local_40;
            if (plVar17 == (lys_when *)0x0) goto LAB_00160501;
          }
          pplVar21 = (lys_node_leaf **)lydict_insert(ctx,*(char **)&plVar20[1].flags,0);
          plVar20 = local_40;
          plVar28->keys = pplVar21;
          if ((lys_restr *)local_40[1].dsc == (lys_restr *)0x0) {
            return (lys_node *)plVar13;
          }
          plVar18 = lys_restr_dup(module,(lys_restr *)local_40[1].dsc,(uint)local_40->padding[1],
                                  local_34,unres);
          plVar28->must = plVar18;
          if (plVar18 != (lys_restr *)0x0) {
            plVar28->tpdf_size = plVar20->padding[1];
            return (lys_node *)plVar13;
          }
          goto LAB_00160501;
        case LYS_CHOICE:
          if (*(lys_when **)plVar20->hash != (lys_when *)0x0) {
            plVar17 = lys_when_dup(module,*(lys_when **)plVar20->hash,local_34,unres);
            *(lys_when **)local_48->hash = plVar17;
            plVar20 = local_40;
            if (plVar17 == (lys_when *)0x0) goto LAB_00160501;
          }
          plVar17 = (lys_when *)plVar20[1].name;
          if ((char)uVar30 == '\0') goto LAB_001602bb;
          if (plVar17 == (lys_when *)0x0) {
            unres_schema_dup(module,unres,plVar20,UNRES_CHOICE_DFLT,local_48);
            return (lys_node *)plVar13;
          }
          plVar26 = plVar13->module;
          if ((plVar26->field_0x40 & 1) != 0) {
            plVar26 = (lys_module *)plVar26->data;
          }
          iVar10 = lys_get_sibling(local_48->child,plVar26->name,0,plVar17->cond,0,0x807d,
                                   (lys_node **)&local_48->when);
          if (iVar10 == 0) {
            return (lys_node *)plVar13;
          }
          uVar29 = 0xcda;
          goto LAB_0015fcb3;
        case LYS_LEAF:
          local_70 = (lys_type *)&local_78->tpdf;
          iVar10 = lys_ingrouping((lys_node *)plVar13);
          local_60 = module;
          iVar10 = lys_type_dup(module,(lys_node *)plVar13,local_70,(lys_type *)&plVar20[1].ref,
                                iVar10,local_34,unres);
          plVar20 = local_40;
          plVar26 = local_60;
          plVar13 = local_50;
          if (iVar10 != 0) goto LAB_00160501;
          plVar19 = (lys_node *)lydict_insert(local_60->ctx,(char *)local_40[1].next,0);
          plVar13 = local_50;
          *(lys_node **)&local_78[1].flags = plVar19;
          iVar10 = local_34;
          if (plVar20[1].prev != (lys_node *)0x0) {
            ly_ilo_change((ly_ctx *)0x0,ILO_IGNORE,&local_b0,(ly_err_item **)0x0);
            plVar5 = local_40->module;
            module_00 = (lys_module *)0x0;
            if ((plVar5 != (lys_module *)0x0) && (module_00 = plVar5, (plVar5->field_0x40 & 1) != 0)
               ) {
              module_00 = (lys_module *)plVar5->data;
            }
            plVar20 = (lys_node *)transform_schema2json(module_00,(char *)local_40[1].prev);
            plVar12 = local_78;
            local_78[1].ext = (lys_ext_instance **)plVar20;
            ly_ilo_restore((ly_ctx *)0x0,local_b0,(ly_err_item *)0x0,0);
            iVar10 = local_34;
            plVar20 = local_40;
            if ((lys_node *)plVar12[1].ext == (lys_node *)0x0) {
              plVar20 = (lys_node *)lydict_insert(ctx,(char *)local_40[1].prev,0);
              local_78[1].ext = (lys_ext_instance **)plVar20;
              plVar20 = local_40;
            }
          }
          if ((lys_restr *)plVar20[1].dsc != (lys_restr *)0x0) {
            plVar18 = lys_restr_dup(plVar26,(lys_restr *)plVar20[1].dsc,(uint)plVar20->padding[3],
                                    iVar10,unres);
            local_78->must = plVar18;
            if (plVar18 == (lys_restr *)0x0) goto LAB_00160501;
            local_78->unique_size = plVar20->padding[3];
          }
          if ((lys_when *)plVar20[1].name == (lys_when *)0x0) {
            return (lys_node *)plVar13;
          }
          plVar17 = lys_when_dup(plVar26,(lys_when *)plVar20[1].name,iVar10,unres);
          plVar12 = local_78;
LAB_0015fd9b:
          plVar12->when = plVar17;
LAB_0015fd9f:
          if (plVar17 != (lys_when *)0x0) {
            return (lys_node *)plVar13;
          }
          goto LAB_00160501;
        case LYS_LEAFLIST:
          local_70 = (lys_type *)&_prev_ilo->tpdf;
          iVar10 = lys_ingrouping((lys_node *)plVar13);
          local_60 = module;
          iVar10 = lys_type_dup(module,(lys_node *)plVar13,local_70,(lys_type *)&plVar20[1].ref,
                                iVar10,local_34,unres);
          plVar20 = local_40;
          plVar26 = local_60;
          plVar13 = local_50;
          if (iVar10 != 0) goto LAB_00160501;
          plVar19 = (lys_node *)lydict_insert(local_60->ctx,(char *)local_40[1].next,0);
          plVar13 = local_50;
          plVar12 = _prev_ilo;
          *(lys_node **)&_prev_ilo[1].flags = plVar19;
          *(undefined4 *)&_prev_ilo[1].iffeature = *(undefined4 *)&plVar20[1].priv;
          *(undefined4 *)((long)&_prev_ilo[1].iffeature + 4) =
               *(undefined4 *)((long)&plVar20[1].priv + 4);
          if ((lys_restr *)plVar20[1].dsc != (lys_restr *)0x0) {
            plVar18 = lys_restr_dup(plVar26,(lys_restr *)plVar20[1].dsc,(uint)plVar20->padding[3],
                                    local_34,unres);
            plVar12->must = plVar18;
            if (plVar18 == (lys_restr *)0x0) goto LAB_00160501;
            plVar12->unique_size = plVar20->padding[3];
          }
          if (plVar20[1].prev != (lys_node *)0x0) {
            bVar1 = plVar20->padding[2];
            plVar20 = (lys_node *)malloc((ulong)((uint)bVar1 * 8));
            plVar12[1].ext = (lys_ext_instance **)plVar20;
            if (plVar20 == (lys_node *)0x0) goto LAB_001601d0;
            plVar12->keys_size = bVar1;
            plVar20 = local_40;
            if (bVar1 != 0) {
              uVar25 = 0;
              do {
                pcVar14 = lydict_insert(ctx,*(char **)((local_40[1].prev)->padding +
                                                      uVar25 * 8 + -0x1c),0);
                *(char **)(((lys_node *)plVar12[1].ext)->padding + uVar25 * 8 + -0x1c) = pcVar14;
                uVar25 = uVar25 + 1;
                plVar20 = local_40;
              } while (uVar25 < plVar12->keys_size);
            }
          }
          if ((lys_when *)plVar20[1].name == (lys_when *)0x0) {
            return (lys_node *)plVar13;
          }
          plVar17 = lys_when_dup(local_60,(lys_when *)plVar20[1].name,local_34,unres);
          local_48 = _prev_ilo;
LAB_001602bb:
          local_48->when = plVar17;
          return (lys_node *)plVar13;
        }
      }
      else {
        if (LVar3 == LYS_LIST) {
          list_orig->min = *(uint32_t *)&local_88[1].iffeature;
          list_orig->max = *(uint32_t *)((long)&local_88[1].iffeature + 4);
          local_60 = module;
          local_54 = uVar30;
          if ((lys_restr *)local_88[1].dsc != (lys_restr *)0x0) {
            plVar18 = lys_restr_dup(module,(lys_restr *)local_88[1].dsc,(uint)local_88->padding[0],
                                    local_34,unres);
            plVar7->must = plVar18;
            if (plVar18 == (lys_restr *)0x0) goto LAB_00160501;
            plVar7->must_size = plVar19->padding[0];
          }
          if ((ulong)plVar19->padding[2] != 0) {
            pplVar21 = (lys_node_leaf **)calloc((ulong)plVar19->padding[2],8);
            plVar12 = list_orig;
            list_orig->keys = pplVar21;
            if (pplVar21 == (lys_node_leaf **)0x0) goto LAB_001601d0;
            pcVar14 = lydict_insert(ctx,(char *)plVar19[1].module,0);
            plVar12->keys_str = pcVar14;
            bVar1 = plVar19->padding[2];
            plVar12->keys_size = bVar1;
            if ((char)local_54 == '\0') {
              memcpy(plVar12->keys,*(void **)&plVar19[1].flags,(ulong)bVar1 << 3);
            }
            else {
              iVar10 = unres_schema_add_node(local_60,unres,plVar12,UNRES_LIST_KEYS,(lys_node *)0x0)
              ;
              if (iVar10 == -1) goto LAB_00160501;
            }
          }
          puStack_90 = unres;
          if (plVar19[1].ext != (lys_ext_instance **)0x0) {
            bVar1 = plVar19->padding[3];
            plVar20 = (lys_node *)(ulong)bVar1;
            plVar23 = (lys_unique *)malloc((ulong)bVar1 << 4);
            list_orig->unique = plVar23;
            if (plVar23 == (lys_unique *)0x0) {
LAB_001604ef:
              ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                     "lys_node_dup_recursion");
              plVar13 = local_50;
              goto LAB_00160501;
            }
            list_orig->unique_size = bVar1;
            if (bVar1 != 0) {
              plVar22 = (lys_node *)0x0;
              do {
                ppcVar24 = (char **)malloc((ulong)*(byte *)(local_88[1].ext + (long)plVar22 * 2 + 1)
                                           << 3);
                plVar13 = list_orig;
                plVar23[(long)plVar22].expr = ppcVar24;
                if (ppcVar24 == (char **)0x0) goto LAB_001604ef;
                uVar2 = *(uint8_t *)(local_88[1].ext + (long)plVar22 * 2 + 1);
                plVar23[(long)plVar22].expr_size = uVar2;
                if (uVar2 != '\0') {
                  uVar25 = 0;
                  local_40 = plVar22;
                  do {
                    pcVar14 = lydict_insert(ctx,(char *)(&local_88[1].ext[(long)plVar22 * 2]->def)
                                                        [uVar25],0);
                    plVar13->unique[(long)plVar22].expr[uVar25] = pcVar14;
                    new_item = (undefined8 *)malloc(0x18);
                    if (new_item == (undefined8 *)0x0) goto LAB_001604ef;
                    *new_item = plVar13;
                    plVar23 = plVar13->unique;
                    new_item[1] = plVar23[(long)plVar22].expr[uVar25];
                    new_item[2] = &plVar23[(long)plVar22].trg_type;
                    unres_schema_dup(local_60,puStack_90,&local_88,UNRES_LIST_UNIQ,new_item);
                    uVar25 = uVar25 + 1;
                    plVar23 = plVar13->unique;
                  } while (uVar25 < plVar23[(long)plVar22].expr_size);
                  plVar20 = (lys_node *)(ulong)plVar13->unique_size;
                  plVar22 = local_40;
                }
                plVar22 = (lys_node *)((long)&plVar22->name + 1);
                plVar19 = local_88;
              } while (plVar22 < plVar20);
            }
          }
          plVar13 = local_50;
          plVar12 = list_orig;
          if ((lys_when *)plVar19[1].name == (lys_when *)0x0) {
            return (lys_node *)local_50;
          }
          plVar17 = lys_when_dup(local_60,(lys_when *)plVar19[1].name,local_34,puStack_90);
          plVar12->when = plVar17;
          goto LAB_0015fd9f;
        }
        if (LVar3 == LYS_ANYXML) {
LAB_0015fd3d:
          if ((lys_restr *)plVar20[1].dsc != (lys_restr *)0x0) {
            plVar18 = lys_restr_dup(module,(lys_restr *)plVar20[1].dsc,(uint)plVar20->padding[3],
                                    local_34,unres);
            plVar12->must = plVar18;
            if (plVar18 == (lys_restr *)0x0) goto LAB_00160501;
            plVar12->unique_size = plVar20->padding[3];
          }
          if ((lys_when *)plVar20[1].name == (lys_when *)0x0) {
            return (lys_node *)plVar13;
          }
          plVar17 = lys_when_dup(module,(lys_when *)plVar20[1].name,local_34,unres);
          goto LAB_0015fd9b;
        }
        if (LVar3 == LYS_CASE) {
          if (*(lys_when **)plVar20->hash == (lys_when *)0x0) {
            return (lys_node *)plVar13;
          }
          plVar17 = lys_when_dup(module,*(lys_when **)plVar20->hash,local_34,unres);
          *(lys_when **)plVar11->hash = plVar17;
          goto LAB_0015fd9f;
        }
      }
    }
    else if ((int)LVar3 < 0x400) {
      if (LVar3 == LYS_NOTIF) {
        return (lys_node *)plVar13;
      }
      if (LVar3 == LYS_RPC) {
        return (lys_node *)plVar13;
      }
      if (LVar3 == LYS_INPUT) {
        return (lys_node *)plVar13;
      }
    }
    else if ((int)LVar3 < 0x4000) {
      if (LVar3 == LYS_OUTPUT) {
        return (lys_node *)plVar13;
      }
      if (LVar3 == LYS_USES) {
        local_68->tpdf = (lys_tpdf *)plVar20[1].ref;
        if (*(lys_when **)plVar20->hash == (lys_when *)0x0) {
          return (lys_node *)plVar13;
        }
        plVar17 = lys_when_dup(module,*(lys_when **)plVar20->hash,local_34,unres);
        *(lys_when **)plVar8->hash = plVar17;
        goto LAB_0015fd9f;
      }
    }
    else {
      if (LVar3 == LYS_ACTION) {
        return (lys_node *)plVar13;
      }
      if (LVar3 == LYS_ANYDATA) goto LAB_0015fd3d;
    }
    uVar29 = 0xd86;
  }
  else {
    if ((int)LVar3 < 0x400) {
      if (LVar3 != LYS_NOTIF) {
        if ((LVar3 == LYS_RPC) || (LVar3 == LYS_INPUT)) goto LAB_0015f699;
        goto switchD_0015f55f_caseD_3;
      }
      __size = 0x80;
LAB_0015f6a3:
      plVar13 = (lys_node_list *)calloc(1,__size);
      plVar28 = (lys_node_list *)0x0;
      local_48 = (lys_node_list *)0x0;
      local_78 = (lys_node_list *)0x0;
      _prev_ilo = (lys_node_list *)0x0;
      list_orig = (lys_node_list *)0x0;
      plVar12 = (lys_node_list *)0x0;
      local_68 = (lys_node_list *)0x0;
      goto LAB_0015f6c6;
    }
    if ((int)LVar3 < 0x4000) {
      if (LVar3 == LYS_OUTPUT) {
LAB_0015f699:
        __size = 0x78;
        goto LAB_0015f6a3;
      }
      if (LVar3 == LYS_USES) {
        local_68 = (lys_node_list *)calloc(1,0x88);
        plVar28 = (lys_node_list *)0x0;
        local_48 = (lys_node_list *)0x0;
        local_78 = (lys_node_list *)0x0;
        _prev_ilo = (lys_node_list *)0x0;
        list_orig = (lys_node_list *)0x0;
        plVar12 = (lys_node_list *)0x0;
        plVar13 = local_68;
        goto LAB_0015f6c6;
      }
    }
    else {
      if (LVar3 == LYS_ACTION) goto LAB_0015f699;
      if (LVar3 == LYS_ANYDATA) goto LAB_0015f66a;
    }
switchD_0015f55f_caseD_3:
    plVar13 = (lys_node_list *)0x0;
    uVar29 = 0xc25;
  }
LAB_0015fcb3:
  ly_log(ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
         "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
         ,uVar29);
LAB_00160501:
  lys_node_free((lys_node *)plVar13,(_func_void_lys_node_ptr_void_ptr *)0x0,0);
  return (lys_node *)0x0;
}

Assistant:

static struct lys_node *
lys_node_dup_recursion(struct lys_module *module, struct lys_node *parent, const struct lys_node *node,
                       struct unres_schema *unres, int shallow, int finalize)
{
    struct lys_node *retval = NULL, *iter, *p;
    struct ly_ctx *ctx = module->ctx;
    enum int_log_opts prev_ilo;
    int i, j, rc;
    unsigned int size, size1, size2;
    struct unres_list_uniq *unique_info;
    uint16_t flags;

    struct lys_node_container *cont = NULL;
    struct lys_node_container *cont_orig = (struct lys_node_container *)node;
    struct lys_node_choice *choice = NULL;
    struct lys_node_choice *choice_orig = (struct lys_node_choice *)node;
    struct lys_node_leaf *leaf = NULL;
    struct lys_node_leaf *leaf_orig = (struct lys_node_leaf *)node;
    struct lys_node_leaflist *llist = NULL;
    struct lys_node_leaflist *llist_orig = (struct lys_node_leaflist *)node;
    struct lys_node_list *list = NULL;
    struct lys_node_list *list_orig = (struct lys_node_list *)node;
    struct lys_node_anydata *any = NULL;
    struct lys_node_anydata *any_orig = (struct lys_node_anydata *)node;
    struct lys_node_uses *uses = NULL;
    struct lys_node_uses *uses_orig = (struct lys_node_uses *)node;
    struct lys_node_rpc_action *rpc = NULL;
    struct lys_node_inout *io = NULL;
    struct lys_node_notif *ntf = NULL;
    struct lys_node_case *cs = NULL;
    struct lys_node_case *cs_orig = (struct lys_node_case *)node;

    /* we cannot just duplicate memory since the strings are stored in
     * dictionary and we need to update dictionary counters.
     */

    switch (node->nodetype) {
    case LYS_CONTAINER:
        cont = calloc(1, sizeof *cont);
        retval = (struct lys_node *)cont;
        break;

    case LYS_CHOICE:
        choice = calloc(1, sizeof *choice);
        retval = (struct lys_node *)choice;
        break;

    case LYS_LEAF:
        leaf = calloc(1, sizeof *leaf);
        retval = (struct lys_node *)leaf;
        break;

    case LYS_LEAFLIST:
        llist = calloc(1, sizeof *llist);
        retval = (struct lys_node *)llist;
        break;

    case LYS_LIST:
        list = calloc(1, sizeof *list);
        retval = (struct lys_node *)list;
        break;

    case LYS_ANYXML:
    case LYS_ANYDATA:
        any = calloc(1, sizeof *any);
        retval = (struct lys_node *)any;
        break;

    case LYS_USES:
        uses = calloc(1, sizeof *uses);
        retval = (struct lys_node *)uses;
        break;

    case LYS_CASE:
        cs = calloc(1, sizeof *cs);
        retval = (struct lys_node *)cs;
        break;

    case LYS_RPC:
    case LYS_ACTION:
        rpc = calloc(1, sizeof *rpc);
        retval = (struct lys_node *)rpc;
        break;

    case LYS_INPUT:
    case LYS_OUTPUT:
        io = calloc(1, sizeof *io);
        retval = (struct lys_node *)io;
        break;

    case LYS_NOTIF:
        ntf = calloc(1, sizeof *ntf);
        retval = (struct lys_node *)ntf;
        break;

    default:
        LOGINT(ctx);
        goto error;
    }
    LY_CHECK_ERR_RETURN(!retval, LOGMEM(ctx), NULL);

    /*
     * duplicate generic part of the structure
     */
    retval->name = lydict_insert(ctx, node->name, 0);
    retval->dsc = lydict_insert(ctx, node->dsc, 0);
    retval->ref = lydict_insert(ctx, node->ref, 0);
    retval->flags = node->flags;

    retval->module = module;
    retval->nodetype = node->nodetype;

    retval->prev = retval;

    /* copying unresolved extensions is not supported */
    if (unres_schema_find(unres, -1, (void *)&node->ext, UNRES_EXT) == -1) {
        retval->ext_size = node->ext_size;
        if (lys_ext_dup(ctx, module, node->ext, node->ext_size, retval, LYEXT_PAR_NODE, &retval->ext, shallow, unres)) {
            goto error;
        }
    }

    if (node->iffeature_size) {
        retval->iffeature_size = node->iffeature_size;
        retval->iffeature = calloc(retval->iffeature_size, sizeof *retval->iffeature);
        LY_CHECK_ERR_GOTO(!retval->iffeature, LOGMEM(ctx), error);
    }

    if (!shallow) {
        for (i = 0; i < node->iffeature_size; ++i) {
            resolve_iffeature_getsizes(&node->iffeature[i], &size1, &size2);
            if (size1) {
                /* there is something to duplicate */

                /* duplicate compiled expression */
                size = (size1 / 4) + (size1 % 4) ? 1 : 0;
                retval->iffeature[i].expr = malloc(size * sizeof *retval->iffeature[i].expr);
                LY_CHECK_ERR_GOTO(!retval->iffeature[i].expr, LOGMEM(ctx), error);
                memcpy(retval->iffeature[i].expr, node->iffeature[i].expr, size * sizeof *retval->iffeature[i].expr);

                /* list of feature pointer must be updated to point to the resulting tree */
                retval->iffeature[i].features = calloc(size2, sizeof *retval->iffeature[i].features);
                LY_CHECK_ERR_GOTO(!retval->iffeature[i].features, LOGMEM(ctx); free(retval->iffeature[i].expr), error);

                for (j = 0; (unsigned int)j < size2; j++) {
                    rc = unres_schema_dup(module, unres, &node->iffeature[i].features[j], UNRES_IFFEAT,
                                          &retval->iffeature[i].features[j]);
                    if (rc == EXIT_FAILURE) {
                        /* feature is resolved in origin, so copy it
                         * - duplication is used for instantiating groupings
                         * and if-feature inside grouping is supposed to be
                         * resolved inside the original grouping, so we want
                         * to keep pointers to features from the grouping
                         * context */
                        retval->iffeature[i].features[j] = node->iffeature[i].features[j];
                    } else if (rc == -1) {
                        goto error;
                    } /* else unres was duplicated */
                }
            }

            /* duplicate if-feature's extensions */
            retval->iffeature[i].ext_size = node->iffeature[i].ext_size;
            if (lys_ext_dup(ctx, module, node->iffeature[i].ext, node->iffeature[i].ext_size,
                            &retval->iffeature[i], LYEXT_PAR_IFFEATURE, &retval->iffeature[i].ext, shallow, unres)) {
                goto error;
            }
        }

        /* inherit config flags */
        p = parent;
        do {
            for (iter = p; iter && (iter->nodetype == LYS_USES); iter = iter->parent);
        } while (iter && iter->nodetype == LYS_AUGMENT && (p = ((struct lys_node_augment *)iter)->target));
        if (iter) {
            flags = iter->flags & LYS_CONFIG_MASK;
        } else {
            /* default */
            flags = LYS_CONFIG_W;
        }

        switch (finalize) {
        case 1:
            /* inherit config flags */
            if (retval->flags & LYS_CONFIG_SET) {
                /* skip nodes with an explicit config value */
                if ((flags & LYS_CONFIG_R) && (retval->flags & LYS_CONFIG_W)) {
                    LOGVAL(ctx, LYE_INARG, LY_VLOG_LYS, retval, "true", "config");
                    LOGVAL(ctx, LYE_SPEC, LY_VLOG_PREV, NULL, "State nodes cannot have configuration nodes as children.");
                    goto error;
                }
                break;
            }

            if (retval->nodetype != LYS_USES) {
                retval->flags = (retval->flags & ~LYS_CONFIG_MASK) | flags;
            }

            /* inherit status */
            if ((parent->flags & LYS_STATUS_MASK) > (retval->flags & LYS_STATUS_MASK)) {
                /* but do it only in case the parent has a stonger status */
                retval->flags &= ~LYS_STATUS_MASK;
                retval->flags |= (parent->flags & LYS_STATUS_MASK);
            }
            break;
        case 2:
            /* erase config flags */
            retval->flags &= ~LYS_CONFIG_MASK;
            retval->flags &= ~LYS_CONFIG_SET;
            break;
        }

        /* connect it to the parent */
        if (lys_node_addchild(parent, retval->module, retval, 0)) {
            goto error;
        }

        /* go recursively */
        if (!(node->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
            LY_TREE_FOR(node->child, iter) {
                if (iter->nodetype & LYS_GROUPING) {
                    /* do not instantiate groupings */
                    continue;
                }
                if (!lys_node_dup_recursion(module, retval, iter, unres, 0, finalize)) {
                    goto error;
                }
            }
        }

        if (finalize == 1) {
            /* check that configuration lists have keys
             * - we really want to check keys_size in original node, because the keys are
             * not yet resolved here, it is done below in nodetype specific part */
            if ((retval->nodetype == LYS_LIST) && (retval->flags & LYS_CONFIG_W)
                    && !((struct lys_node_list *)node)->keys_size) {
                LOGVAL(ctx, LYE_MISSCHILDSTMT, LY_VLOG_LYS, retval, "key", "list");
                goto error;
            }
        }
    } else {
        memcpy(retval->iffeature, node->iffeature, retval->iffeature_size * sizeof *retval->iffeature);
    }

    /*
     * duplicate specific part of the structure
     */
    switch (node->nodetype) {
    case LYS_CONTAINER:
        if (cont_orig->when) {
            cont->when = lys_when_dup(module, cont_orig->when, shallow, unres);
            LY_CHECK_GOTO(!cont->when, error);
        }
        cont->presence = lydict_insert(ctx, cont_orig->presence, 0);

        if (cont_orig->must) {
            cont->must = lys_restr_dup(module, cont_orig->must, cont_orig->must_size, shallow, unres);
            LY_CHECK_GOTO(!cont->must, error);
            cont->must_size = cont_orig->must_size;
        }

        /* typedefs are not needed in instantiated grouping, nor the deviation's shallow copy */

        break;
    case LYS_CHOICE:
        if (choice_orig->when) {
            choice->when = lys_when_dup(module, choice_orig->when, shallow, unres);
            LY_CHECK_GOTO(!choice->when, error);
        }

        if (!shallow) {
            if (choice_orig->dflt) {
                rc = lys_get_sibling(choice->child, lys_node_module(retval)->name, 0, choice_orig->dflt->name, 0,
                                            LYS_ANYDATA | LYS_CASE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST,
                                            (const struct lys_node **)&choice->dflt);
                if (rc) {
                    if (rc == EXIT_FAILURE) {
                        LOGINT(ctx);
                    }
                    goto error;
                }
            } else {
                /* useless to check return value, we don't know whether
                * there really wasn't any default defined or it just hasn't
                * been resolved, we just hope for the best :)
                */
                unres_schema_dup(module, unres, choice_orig, UNRES_CHOICE_DFLT, choice);
            }
        } else {
            choice->dflt = choice_orig->dflt;
        }
        break;

    case LYS_LEAF:
        if (lys_type_dup(module, retval, &(leaf->type), &(leaf_orig->type), lys_ingrouping(retval), shallow, unres)) {
            goto error;
        }
        leaf->units = lydict_insert(module->ctx, leaf_orig->units, 0);

        if (leaf_orig->dflt) {
            /* transform into JSON format, may not be possible later */
            ly_ilo_change(NULL, ILO_IGNORE, &prev_ilo, NULL);
            leaf->dflt = transform_schema2json(lys_main_module(leaf_orig->module), leaf_orig->dflt);
            ly_ilo_restore(NULL, prev_ilo, NULL, 0);
            if (!leaf->dflt) {
                /* invalid identityref format or it was already transformed, so ignore the error here */
                leaf->dflt = lydict_insert(ctx, leaf_orig->dflt, 0);
            }
        }

        if (leaf_orig->must) {
            leaf->must = lys_restr_dup(module, leaf_orig->must, leaf_orig->must_size, shallow, unres);
            LY_CHECK_GOTO(!leaf->must, error);
            leaf->must_size = leaf_orig->must_size;
        }

        if (leaf_orig->when) {
            leaf->when = lys_when_dup(module, leaf_orig->when, shallow, unres);
            LY_CHECK_GOTO(!leaf->when, error);
        }
        break;

    case LYS_LEAFLIST:
        if (lys_type_dup(module, retval, &(llist->type), &(llist_orig->type), lys_ingrouping(retval), shallow, unres)) {
            goto error;
        }
        llist->units = lydict_insert(module->ctx, llist_orig->units, 0);

        llist->min = llist_orig->min;
        llist->max = llist_orig->max;

        if (llist_orig->must) {
            llist->must = lys_restr_dup(module, llist_orig->must, llist_orig->must_size, shallow, unres);
            LY_CHECK_GOTO(!llist->must, error);
            llist->must_size = llist_orig->must_size;
        }

        if (llist_orig->dflt) {
            llist->dflt = malloc(llist_orig->dflt_size * sizeof *llist->dflt);
            LY_CHECK_ERR_GOTO(!llist->dflt, LOGMEM(ctx), error);
            llist->dflt_size = llist_orig->dflt_size;

            for (i = 0; i < llist->dflt_size; i++) {
                llist->dflt[i] = lydict_insert(ctx, llist_orig->dflt[i], 0);
            }
        }

        if (llist_orig->when) {
            llist->when = lys_when_dup(module, llist_orig->when, shallow, unres);
        }
        break;

    case LYS_LIST:
        list->min = list_orig->min;
        list->max = list_orig->max;

        if (list_orig->must) {
            list->must = lys_restr_dup(module, list_orig->must, list_orig->must_size, shallow, unres);
            LY_CHECK_GOTO(!list->must, error);
            list->must_size = list_orig->must_size;
        }

        /* typedefs are not needed in instantiated grouping, nor the deviation's shallow copy */

        if (list_orig->keys_size) {
            list->keys = calloc(list_orig->keys_size, sizeof *list->keys);
            LY_CHECK_ERR_GOTO(!list->keys, LOGMEM(ctx), error);
            list->keys_str = lydict_insert(ctx, list_orig->keys_str, 0);
            list->keys_size = list_orig->keys_size;

            if (!shallow) {
                if (unres_schema_add_node(module, unres, list, UNRES_LIST_KEYS, NULL) == -1) {
                    goto error;
                }
            } else {
                memcpy(list->keys, list_orig->keys, list_orig->keys_size * sizeof *list->keys);
            }
        }

        if (list_orig->unique) {
            list->unique = malloc(list_orig->unique_size * sizeof *list->unique);
            LY_CHECK_ERR_GOTO(!list->unique, LOGMEM(ctx), error);
            list->unique_size = list_orig->unique_size;

            for (i = 0; i < list->unique_size; ++i) {
                list->unique[i].expr = malloc(list_orig->unique[i].expr_size * sizeof *list->unique[i].expr);
                LY_CHECK_ERR_GOTO(!list->unique[i].expr, LOGMEM(ctx), error);
                list->unique[i].expr_size = list_orig->unique[i].expr_size;
                for (j = 0; j < list->unique[i].expr_size; j++) {
                    list->unique[i].expr[j] = lydict_insert(ctx, list_orig->unique[i].expr[j], 0);

                    /* if it stays in unres list, duplicate it also there */
                    unique_info = malloc(sizeof *unique_info);
                    LY_CHECK_ERR_GOTO(!unique_info, LOGMEM(ctx), error);
                    unique_info->list = (struct lys_node *)list;
                    unique_info->expr = list->unique[i].expr[j];
                    unique_info->trg_type = &list->unique[i].trg_type;
                    unres_schema_dup(module, unres, &list_orig, UNRES_LIST_UNIQ, unique_info);
                }
            }
        }

        if (list_orig->when) {
            list->when = lys_when_dup(module, list_orig->when, shallow, unres);
            LY_CHECK_GOTO(!list->when, error);
        }
        break;

    case LYS_ANYXML:
    case LYS_ANYDATA:
        if (any_orig->must) {
            any->must = lys_restr_dup(module, any_orig->must, any_orig->must_size, shallow, unres);
            LY_CHECK_GOTO(!any->must, error);
            any->must_size = any_orig->must_size;
        }

        if (any_orig->when) {
            any->when = lys_when_dup(module, any_orig->when, shallow, unres);
            LY_CHECK_GOTO(!any->when, error);
        }
        break;

    case LYS_USES:
        uses->grp = uses_orig->grp;

        if (uses_orig->when) {
            uses->when = lys_when_dup(module, uses_orig->when, shallow, unres);
            LY_CHECK_GOTO(!uses->when, error);
        }
        /* it is not needed to duplicate refine, nor augment. They are already applied to the uses children */
        break;

    case LYS_CASE:
        if (cs_orig->when) {
            cs->when = lys_when_dup(module, cs_orig->when, shallow, unres);
            LY_CHECK_GOTO(!cs->when, error);
        }
        break;

    case LYS_ACTION:
    case LYS_RPC:
    case LYS_INPUT:
    case LYS_OUTPUT:
    case LYS_NOTIF:
        /* typedefs are not needed in instantiated grouping, nor the deviation's shallow copy */
        break;

    default:
        /* LY_NODE_AUGMENT */
        LOGINT(ctx);
        goto error;
    }

    return retval;

error:
    lys_node_free(retval, NULL, 0);
    return NULL;
}